

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O0

UBool uhash_compareIChars_63(UHashTok key1,UHashTok key2)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  UHashTok local_30;
  char *p2;
  char *p1;
  UHashTok key2_local;
  UHashTok key1_local;
  
  if (key1.pointer == key2.pointer) {
    key1_local._7_1_ = 1;
  }
  else if ((key1.pointer == (void *)0x0) ||
          (local_30 = key2, p2 = (char *)key1, key2.pointer == (void *)0x0)) {
    key1_local._7_1_ = 0;
  }
  else {
    while( true ) {
      bVar3 = false;
      if (*p2 != '\0') {
        cVar1 = uprv_asciitolower_63(*p2);
        cVar2 = uprv_asciitolower_63(*local_30.pointer);
        bVar3 = cVar1 == cVar2;
      }
      if (!bVar3) break;
      p2 = p2 + 1;
      local_30.pointer = local_30.pointer + 1;
    }
    key1_local._7_1_ = *p2 == *local_30.pointer;
  }
  return key1_local._7_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
uhash_compareIChars(const UHashTok key1, const UHashTok key2) {
    const char *p1 = (const char*) key1.pointer;
    const char *p2 = (const char*) key2.pointer;
    if (p1 == p2) {
        return TRUE;
    }
    if (p1 == NULL || p2 == NULL) {
        return FALSE;
    }
    while (*p1 != 0 && uprv_tolower(*p1) == uprv_tolower(*p2)) {
        ++p1;
        ++p2;
    }
    return (UBool)(*p1 == *p2);
}